

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test::TestBody
          (CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  CoinSelectionOption *in_R9;
  Amount AVar3;
  bool use_bnb;
  _Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_110;
  AssertionResult gtest_ar_;
  AssertHelper local_e0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  AssertionResult gtest_ar;
  ConfidentialAssetId local_88;
  Amount local_58;
  Amount local_48;
  Amount fee;
  Amount select_value;
  
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x25402d4);
  local_48.amount_ = AVar3.amount_;
  local_48.ignore_check_ = AVar3.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_58.amount_ = AVar3.amount_;
  local_58.ignore_check_ = AVar3.ignore_check_;
  use_bnb = false;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    GetElementsUtxoList();
    GetBitcoinOption();
    in_R9 = (CoinSelectionOption *)&gtest_ar;
    cfd::CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_,&exp_selection,&local_48,
               (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&local_110,&exp_filter,in_R9,
               &local_58,&select_value,&fee,&use_bnb);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&ret,&gtest_ar_);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
              ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_88);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base(&local_110);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
             ,0x611,
             "Expected: ret = exp_selection.SelectCoins( target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  gtest_ar_._0_8_ =
       ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_110._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","0",(unsigned_long *)&gtest_ar_,(int *)&local_110);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x613,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_110._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"select_value.GetSatoshiValue()","0",(long *)&gtest_ar_,
             (int *)&local_110);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x614,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_110._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","0",(long *)&gtest_ar_,(int *)&local_110)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x615,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,use_bnb) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb != false) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","true",
               "false",&in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x616,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(39060180);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}